

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::StoreFindResult(cmFindBase *this,string *value)

{
  string *psVar1;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  pointer pcVar5;
  size_type sVar6;
  cmMakefile *pcVar7;
  char (*args_1) [6];
  string_view value_00;
  string_view value_01;
  string_view separator;
  string notFound;
  string local_c8;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
  sVar6 = value->_M_string_length;
  if (sVar6 != 0) {
    pcVar7 = (this->super_cmFindCommon).Makefile;
    psVar1 = &this->VariableName;
    if (this->StoreResultInCache == true) {
      cmMakefile::AddCacheDefinition
                (pcVar7,psVar1,value,(this->VariableDocumentation)._M_dataplus._M_p,
                 this->VariableType,PVar3 == NEW);
      if (PVar4 != NEW) {
        return;
      }
      bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar1);
      if (!bVar2) {
        return;
      }
      pcVar7 = (this->super_cmFindCommon).Makefile;
      pcVar5 = (value->_M_dataplus)._M_p;
      sVar6 = value->_M_string_length;
    }
    else {
      pcVar5 = (value->_M_dataplus)._M_p;
    }
    value_01._M_str = pcVar5;
    value_01._M_len = sVar6;
    cmMakefile::AddDefinition(pcVar7,psVar1,value_01);
    return;
  }
  psVar1 = &this->VariableName;
  local_58.View_._M_str = (this->VariableName)._M_dataplus._M_p;
  local_58.View_._M_len = (this->VariableName)._M_string_length;
  local_88.View_._M_len = 9;
  local_88.View_._M_str = "-NOTFOUND";
  cmStrCat<>(&notFound,&local_58,&local_88);
  pcVar7 = (this->super_cmFindCommon).Makefile;
  if (this->StoreResultInCache == true) {
    cmMakefile::AddCacheDefinition
              (pcVar7,psVar1,notFound._M_dataplus._M_p,
               (this->VariableDocumentation)._M_dataplus._M_p,this->VariableType,PVar3 == NEW);
    if ((PVar4 != NEW) ||
       (bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar1),
       !bVar2)) goto LAB_004444c1;
    pcVar7 = (this->super_cmFindCommon).Makefile;
  }
  value_00._M_str = notFound._M_dataplus._M_p;
  value_00._M_len = notFound._M_string_length;
  cmMakefile::AddDefinition(pcVar7,psVar1,value_00);
LAB_004444c1:
  if (this->Required == true) {
    pcVar7 = (this->super_cmFindCommon).Makefile;
    local_58.View_._M_len = 0xf;
    local_58.View_._M_str = "Could not find ";
    local_88.View_._M_str = (this->VariableName)._M_dataplus._M_p;
    local_88.View_._M_len = (this->VariableName)._M_string_length;
    bVar2 = std::operator==(&this->FindCommandName,"find_file");
    if (bVar2) {
      args_1 = (char (*) [6])0x5fe2e9;
    }
    else {
      bVar2 = std::operator==(&this->FindCommandName,"find_path");
      args_1 = (char (*) [6])0x6769c0;
      if (bVar2) {
        args_1 = (char (*) [6])0x5fe2e9;
      }
    }
    separator._M_str = ", ";
    separator._M_len = 2;
    cmJoin(&local_a8,&this->Names,separator,(string_view)ZEXT816(0));
    cmStrCat<char[22],char[6],char[3],std::__cxx11::string>
              (&local_c8,&local_58,&local_88,(char (*) [22])" using the following ",args_1,
               (char (*) [3])0x640611,&local_a8);
    cmMakefile::IssueMessage(pcVar7,FATAL_ERROR,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  std::__cxx11::string::~string((string *)&notFound);
  return;
}

Assistant:

void cmFindBase::StoreFindResult(const std::string& value)
{
  bool force =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) == cmPolicies::NEW;
  bool updateNormalVariable =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) == cmPolicies::NEW;

  if (!value.empty()) {
    if (this->StoreResultInCache) {
      this->Makefile->AddCacheDefinition(this->VariableName, value,
                                         this->VariableDocumentation.c_str(),
                                         this->VariableType, force);
      if (updateNormalVariable &&
          this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
        this->Makefile->AddDefinition(this->VariableName, value);
      }
    } else {
      this->Makefile->AddDefinition(this->VariableName, value);
    }

    return;
  }

  auto notFound = cmStrCat(this->VariableName, "-NOTFOUND");
  if (this->StoreResultInCache) {
    this->Makefile->AddCacheDefinition(this->VariableName, notFound,
                                       this->VariableDocumentation.c_str(),
                                       this->VariableType, force);
    if (updateNormalVariable &&
        this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
      this->Makefile->AddDefinition(this->VariableName, notFound);
    }
  } else {
    this->Makefile->AddDefinition(this->VariableName, notFound);
  }

  if (this->Required) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Could not find ", this->VariableName, " using the following ",
               (this->FindCommandName == "find_file" ||
                    this->FindCommandName == "find_path"
                  ? "files"
                  : "names"),
               ": ", cmJoin(this->Names, ", ")));
    cmSystemTools::SetFatalErrorOccurred();
  }
}